

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  istream *piVar5;
  bool bVar6;
  Token local_3c0;
  undefined1 local_390 [8];
  Token t;
  undefined1 local_340 [8];
  Tokenizer tokenizer;
  undefined1 local_278 [8];
  string line;
  string program;
  istream local_228 [8];
  ifstream file;
  bool verbose;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ReqLang Interpreter");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"  Usage: reqlang file.req <flags>");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"  Flags:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"    -v : Verbose output");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
  }
  else {
    bVar6 = false;
    if (2 < argc) {
      iVar3 = strcmp(argv[2],"-v");
      bVar6 = iVar3 == 0;
    }
    std::ifstream::ifstream(local_228);
    std::ifstream::open(local_228,argv[1],8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"No file found (");
      poVar4 = std::operator<<(poVar4,argv[1]);
      std::operator<<(poVar4,")");
      argv_local._4_4_ = 1;
    }
    else {
      std::__cxx11::string::string((string *)(line.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_278);
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_228,(string *)local_278);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar2) break;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&tokenizer.currentToken.value.
                               super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                               .
                               super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                               .
                               super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                               .
                               super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                       + 0x20),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_278,"\n");
        std::__cxx11::string::operator+=
                  ((string *)(line.field_2._M_local_buf + 8),
                   (string *)
                   ((long)&tokenizer.currentToken.value.
                           super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           .
                           super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                           .
                           super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                           .
                           super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                   + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&tokenizer.currentToken.value.
                           super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           .
                           super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                           .
                           super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                           .
                           super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                   + 0x20));
      }
      std::__cxx11::string::pop_back();
      if (bVar6) {
        poVar4 = std::operator<<((ostream *)&std::cout,"[TOK] Starting");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::string
                ((string *)
                 ((long)&t.value.
                         super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         .
                         super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                 + 0x20),(string *)(line.field_2._M_local_buf + 8));
      Tokenizer::Tokenizer
                ((Tokenizer *)local_340,
                 (string *)
                 ((long)&t.value.
                         super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         .
                         super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                 + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&t.value.
                         super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         .
                         super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                         .
                         super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
                 + 0x20));
      Token::Token((Token *)local_390);
      do {
        Tokenizer::getNextToken(&local_3c0,(Tokenizer *)local_340);
        Token::operator=((Token *)local_390,&local_3c0);
        Token::~Token(&local_3c0);
        poVar4 = operator<<((ostream *)&std::cout,(Token *)local_390);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      } while (local_390._0_4_ != Eof);
      argv_local._4_4_ = 0;
      Token::~Token((Token *)local_390);
      Tokenizer::~Tokenizer((Tokenizer *)local_340);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
    }
    std::ifstream::~ifstream(local_228);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2) {
        cout << "ReqLang Interpreter" << endl
             << "  Usage: reqlang file.req <flags>" << endl
             << "  Flags:" << endl
             << "    -v : Verbose output" << endl;
        return 0;
    }

    bool verbose = argc > 2 && strcmp(argv[2], "-v") == 0;

    ifstream file;
    file.open(argv[1]);
    if (!file.is_open()) {
        cerr << "No file found (" << argv[1] << ")";
        return 1;
    }

    string program;
    string line;
    while (getline(file, line)) {
        program += line + "\n";
    }
    program.pop_back();

    if (verbose) cout << "[TOK] Starting" << endl;

    Tokenizer tokenizer = Tokenizer(program);
    Token t;
    do {
        t = tokenizer.getNextToken();
        cout << t << endl;
    } while (t.type != Eof);

    return 0;
}